

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_zip.c
# Opt level: O0

PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *io,PHYSFS_sint64 _pos,PHYSFS_uint64 offset)

{
  code *pcVar1;
  undefined1 *ptr;
  void *pvVar2;
  PHYSFS_uint8 *pPVar3;
  PHYSFS_sint64 PVar4;
  int iVar5;
  undefined1 *puVar6;
  long lVar7;
  undefined1 auStack_68 [8];
  undefined1 *local_60;
  int local_54;
  void *pvStack_50;
  PHYSFS_sint32 i;
  PHYSFS_uint8 *buf;
  size_t len;
  size_t maxbuflen;
  PHYSFS_uint64 pos;
  PHYSFS_uint64 PStack_28;
  PHYSFS_uint32 ui32;
  PHYSFS_uint64 offset_local;
  PHYSFS_sint64 _pos_local;
  PHYSFS_Io *io_local;
  
  maxbuflen = _pos;
  PStack_28 = offset;
  offset_local = _pos;
  _pos_local = (PHYSFS_sint64)io;
  if (_pos < 1) {
    __assert_fail("_pos > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jarikomppa[P]physfs_magicstream/src/physfs_archiver_zip.c"
                  ,0x4aa,
                  "PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *, PHYSFS_sint64, PHYSFS_uint64)"
                 );
  }
  iVar5 = (*io->seek)(io,offset);
  if (iVar5 == 0) {
    return -1;
  }
  iVar5 = readui32((PHYSFS_Io *)_pos_local,(PHYSFS_uint32 *)((long)&pos + 4));
  if (iVar5 == 0) {
    return -1;
  }
  if (pos._4_4_ == 0x6064b50) {
    return PStack_28;
  }
  if (0x38 < maxbuflen) {
    iVar5 = (**(code **)(_pos_local + 0x20))(_pos_local,maxbuflen - 0x38);
    if (iVar5 == 0) {
      return -1;
    }
    iVar5 = readui32((PHYSFS_Io *)_pos_local,(PHYSFS_uint32 *)((long)&pos + 4));
    if (iVar5 == 0) {
      return -1;
    }
    if (pos._4_4_ == 0x6064b50) {
      return maxbuflen - 0x38;
    }
  }
  if (0x54 < maxbuflen) {
    iVar5 = (**(code **)(_pos_local + 0x20))(_pos_local,maxbuflen - 0x54);
    if (iVar5 == 0) {
      return -1;
    }
    iVar5 = readui32((PHYSFS_Io *)_pos_local,(PHYSFS_uint32 *)((long)&pos + 4));
    if (iVar5 == 0) {
      return -1;
    }
    if (pos._4_4_ == 0x6064b50) {
      return maxbuflen - 0x54;
    }
  }
  puVar6 = auStack_68;
  if ((PStack_28 < maxbuflen) && (puVar6 = auStack_68, 4 < maxbuflen)) {
    len = 0x40000;
    buf = (PHYSFS_uint8 *)(maxbuflen - PStack_28);
    pvStack_50 = (void *)0x0;
    if ((PHYSFS_uint8 *)0x40000 < buf) {
      buf = (PHYSFS_uint8 *)0x40000;
    }
    pPVar3 = buf;
    if (buf < (PHYSFS_uint8 *)0x100) {
      local_60 = auStack_68 + -((ulong)(buf + 0x17) & 0xfffffffffffffff0);
      puVar6 = local_60;
    }
    else {
      local_60 = (undefined1 *)0x0;
      puVar6 = auStack_68;
    }
    ptr = local_60;
    *(undefined8 *)(puVar6 + -8) = 0x122bda;
    pvStack_50 = __PHYSFS_initSmallAlloc(ptr,(size_t)pPVar3);
    PVar4 = _pos_local;
    if (pvStack_50 == (void *)0x0) {
      *(undefined8 *)(puVar6 + -8) = 0x122bef;
      PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
      return -1;
    }
    pcVar1 = *(code **)(_pos_local + 0x20);
    lVar7 = maxbuflen - (long)buf;
    *(undefined8 *)(puVar6 + -8) = 0x122c14;
    iVar5 = (*pcVar1)(PVar4,lVar7);
    PVar4 = _pos_local;
    pPVar3 = buf;
    pvVar2 = pvStack_50;
    if (iVar5 != 0) {
      *(undefined8 *)(puVar6 + -8) = 0x122c2a;
      iVar5 = __PHYSFS_readAll((PHYSFS_Io *)PVar4,pvVar2,(size_t)pPVar3);
      pvVar2 = pvStack_50;
      if (iVar5 != 0) {
        for (local_54 = (int)buf + -4; -1 < local_54; local_54 = local_54 + -1) {
          if ((((*(char *)((long)pvStack_50 + (long)local_54) == 'P') &&
               (*(char *)((long)pvStack_50 + (long)(local_54 + 1)) == 'K')) &&
              (*(char *)((long)pvStack_50 + (long)(local_54 + 2)) == '\x06')) &&
             (*(char *)((long)pvStack_50 + (long)(local_54 + 3)) == '\x06')) {
            *(undefined8 *)(puVar6 + -8) = 0x122cb6;
            __PHYSFS_smallFree(pvVar2);
            return maxbuflen - ((long)buf - (long)local_54);
          }
        }
        *(undefined8 *)(puVar6 + -8) = 0x122ce7;
        __PHYSFS_smallFree(pvVar2);
        goto LAB_00122ce7;
      }
    }
    pvVar2 = pvStack_50;
    *(undefined8 *)(puVar6 + -8) = 0x122c38;
    __PHYSFS_smallFree(pvVar2);
  }
  else {
LAB_00122ce7:
    *(undefined8 *)(puVar6 + -8) = 0x122cf3;
    PHYSFS_setErrorCode(PHYSFS_ERR_CORRUPT);
  }
  return -1;
}

Assistant:

static PHYSFS_sint64 zip64_find_end_of_central_dir(PHYSFS_Io *io,
                                                   PHYSFS_sint64 _pos,
                                                   PHYSFS_uint64 offset)
{
    /*
     * Naturally, the offset is useless to us; it is the offset from the
     *  start of file, which is meaningless if we've appended this .zip to
     *  a self-extracting .exe. We need to find this on our own. It should
     *  be directly before the locator record, but the record in question,
     *  like the original end-of-central-directory record, ends with a
     *  variable-length field. Unlike the original, which has to store the
     *  size of that variable-length field in a 16-bit int and thus has to be
     *  within 64k, the new one gets 64-bits.
     *
     * Fortunately, the only currently-specified record for that variable
     *  length block is some weird proprietary thing that deals with EBCDIC
     *  and tape backups or something. So we don't seek far.
     */

    PHYSFS_uint32 ui32;
    const PHYSFS_uint64 pos = (PHYSFS_uint64) _pos;

    assert(_pos > 0);

    /* Try offset specified in the Zip64 end of central directory locator. */
    /* This works if the entire PHYSFS_Io is the zip file. */
    BAIL_IF_ERRPASS(!io->seek(io, offset), -1);
    BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
    if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
        return offset;

    /* Try 56 bytes before the Zip64 end of central directory locator. */
    /* This works if the record isn't variable length and is version 1. */
    if (pos > 56)
    {
        BAIL_IF_ERRPASS(!io->seek(io, pos-56), -1);
        BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
        if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
            return pos-56;
    } /* if */

    /* Try 84 bytes before the Zip64 end of central directory locator. */
    /* This works if the record isn't variable length and is version 2. */
    if (pos > 84)
    {
        BAIL_IF_ERRPASS(!io->seek(io, pos-84), -1);
        BAIL_IF_ERRPASS(!readui32(io, &ui32), -1);
        if (ui32 == ZIP64_END_OF_CENTRAL_DIR_SIG)
            return pos-84;
    } /* if */

    /* Ok, brute force: we know it's between (offset) and (pos) somewhere. */
    /*  Just try moving back at most 256k. Oh well. */
    if ((offset < pos) && (pos > 4))
    {
        const size_t maxbuflen = 256 * 1024;
        size_t len = (size_t) (pos - offset);
        PHYSFS_uint8 *buf = NULL;
        PHYSFS_sint32 i;

        if (len > maxbuflen)
            len = maxbuflen;

        buf = (PHYSFS_uint8 *) __PHYSFS_smallAlloc(len);
        BAIL_IF(!buf, PHYSFS_ERR_OUT_OF_MEMORY, -1);

        if (!io->seek(io, pos - len) || !__PHYSFS_readAll(io, buf, len))
        {
            __PHYSFS_smallFree(buf);
            return -1;  /* error was set elsewhere. */
        } /* if */

        for (i = (PHYSFS_sint32) (len - 4); i >= 0; i--)
        {
            if ( (buf[i] == 0x50) && (buf[i+1] == 0x4b) &&
                 (buf[i+2] == 0x06) && (buf[i+3] == 0x06) )
            {
                __PHYSFS_smallFree(buf);
                return pos - ((PHYSFS_sint64) (len - i));
            } /* if */
        } /* for */

        __PHYSFS_smallFree(buf);
    } /* if */

    BAIL(PHYSFS_ERR_CORRUPT, -1);  /* didn't find it. */
}